

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fTextureSpecificationTests.cpp
# Opt level: O1

void __thiscall
deqp::gles3::Functional::TexSubImage2DBufferCase::createTexture(TexSubImage2DBufferCase *this)

{
  ContextWrapper *this_00;
  TextureFormat *this_01;
  TextureFormatInfo *minVal;
  Vec4 *maxVal;
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  TransferFormat TVar5;
  int i_1;
  int iVar6;
  long lVar7;
  uint rowPitch;
  deUint32 buf;
  vector<unsigned_char,_std::allocator<unsigned_char>_> data;
  deUint32 tex;
  TextureFormat *local_d0;
  Vec4 colorB;
  Vec4 cScale;
  Vector<float,_4> res_1;
  Vec4 colorA;
  Vec4 cBias;
  float local_40 [4];
  
  this_01 = &(this->super_Texture2DSpecCase).m_texFormat;
  TVar5 = glu::getTransferFormat((this->super_Texture2DSpecCase).m_texFormat);
  local_d0 = this_01;
  iVar4 = tcu::TextureFormat::getPixelSize(this_01);
  tex = 0;
  buf = 0;
  data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this_00 = &(this->super_Texture2DSpecCase).super_TextureSpecCase.super_ContextWrapper;
  sglr::ContextWrapper::glGenTextures(this_00,1,&tex);
  sglr::ContextWrapper::glBindTexture(this_00,0xde1,tex);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
            (&data,(long)(int)(((this->super_Texture2DSpecCase).m_width * iVar4 + 3U & 0xfffffffc) *
                              (this->super_Texture2DSpecCase).m_height));
  iVar6 = (this->super_Texture2DSpecCase).m_width;
  tcu::PixelBufferAccess::PixelBufferAccess
            ((PixelBufferAccess *)&res_1,local_d0,iVar6,(this->super_Texture2DSpecCase).m_height,1,
             iVar6 * iVar4 + 3U & 0xfffffffc,0,
             data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start);
  minVal = &(this->super_Texture2DSpecCase).m_texFormatInfo;
  maxVal = &(this->super_Texture2DSpecCase).m_texFormatInfo.valueMax;
  tcu::fillWithComponentGradients((PixelBufferAccess *)&res_1,&minVal->valueMin,maxVal);
  sglr::ContextWrapper::glTexImage2D
            (this_00,0xde1,0,*(int *)&(this->super_Texture2DSpecCase).field_0xd4,
             (this->super_Texture2DSpecCase).m_width,(this->super_Texture2DSpecCase).m_height,0,
             TVar5.format,TVar5.dataType,
             data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start);
  iVar6 = this->m_rowLength;
  if (iVar6 < 1) {
    iVar6 = this->m_subW;
  }
  iVar1 = this->m_subH;
  iVar2 = this->m_alignment;
  iVar3 = this->m_skipRows;
  cScale.m_data[0] = 0.0;
  cScale.m_data[1] = 0.0;
  cScale.m_data[2] = 0.0;
  cScale.m_data[3] = 0.0;
  lVar7 = 0;
  do {
    cScale.m_data[lVar7] =
         maxVal->m_data[lVar7] -
         (this->super_Texture2DSpecCase).m_texFormatInfo.valueMin.m_data[lVar7];
    lVar7 = lVar7 + 1;
  } while (lVar7 != 4);
  rowPitch = iVar2 + -1 + iVar6 * iVar4 & -iVar2;
  cBias.m_data._0_8_ = *(undefined8 *)(minVal->valueMin).m_data;
  cBias.m_data._8_8_ =
       *(undefined8 *)((this->super_Texture2DSpecCase).m_texFormatInfo.valueMin.m_data + 2);
  colorB.m_data[0] = 1.0;
  colorB.m_data[1] = 0.0;
  colorB.m_data[2] = 0.0;
  colorB.m_data[3] = 1.0;
  res_1.m_data[0] = 0.0;
  res_1.m_data[1] = 0.0;
  res_1.m_data[2] = 0.0;
  res_1.m_data[3] = 0.0;
  lVar7 = 0;
  do {
    res_1.m_data[lVar7] = colorB.m_data[lVar7] * cScale.m_data[lVar7];
    lVar7 = lVar7 + 1;
  } while (lVar7 != 4);
  colorA.m_data[0] = 0.0;
  colorA.m_data[1] = 0.0;
  colorA.m_data[2] = 0.0;
  colorA.m_data[3] = 0.0;
  lVar7 = 0;
  do {
    colorA.m_data[lVar7] = res_1.m_data[lVar7] + cBias.m_data[lVar7];
    lVar7 = lVar7 + 1;
  } while (lVar7 != 4);
  local_40[0] = 0.0;
  local_40[1] = 1.0;
  local_40[2] = 0.0;
  local_40[3] = 1.0;
  res_1.m_data[0] = 0.0;
  res_1.m_data[1] = 0.0;
  res_1.m_data[2] = 0.0;
  res_1.m_data[3] = 0.0;
  lVar7 = 0;
  do {
    res_1.m_data[lVar7] = local_40[lVar7] * cScale.m_data[lVar7];
    lVar7 = lVar7 + 1;
  } while (lVar7 != 4);
  colorB.m_data[0] = 0.0;
  colorB.m_data[1] = 0.0;
  colorB.m_data[2] = 0.0;
  colorB.m_data[3] = 0.0;
  lVar7 = 0;
  do {
    colorB.m_data[lVar7] = res_1.m_data[lVar7] + cBias.m_data[lVar7];
    lVar7 = lVar7 + 1;
  } while (lVar7 != 4);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
            (&data,(long)(int)((iVar3 + iVar1) * rowPitch + this->m_offset));
  tcu::PixelBufferAccess::PixelBufferAccess
            ((PixelBufferAccess *)&res_1,local_d0,this->m_subW,this->m_subH,1,rowPitch,0,
             data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start +
             (long)this->m_offset + (long)(this->m_skipPixels * iVar4) +
             (long)(int)(this->m_skipRows * rowPitch));
  tcu::fillWithGrid((PixelBufferAccess *)&res_1,4,&colorA,&colorB);
  sglr::ContextWrapper::glGenBuffers(this_00,1,&buf);
  sglr::ContextWrapper::glBindBuffer(this_00,0x88ec,buf);
  sglr::ContextWrapper::glBufferData
            (this_00,0x88ec,
             (long)((int)data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                         _M_impl.super__Vector_impl_data._M_finish -
                   (int)data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_start),
             data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start,0x88e4);
  sglr::ContextWrapper::glPixelStorei(this_00,0xcf2,this->m_rowLength);
  sglr::ContextWrapper::glPixelStorei(this_00,0xcf3,this->m_skipRows);
  sglr::ContextWrapper::glPixelStorei(this_00,0xcf4,this->m_skipPixels);
  sglr::ContextWrapper::glPixelStorei(this_00,0xcf5,this->m_alignment);
  sglr::ContextWrapper::glTexSubImage2D
            (this_00,0xde1,0,this->m_subX,this->m_subY,this->m_subW,this->m_subH,TVar5.format,
             TVar5.dataType,(void *)(long)this->m_offset);
  if (data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void createTexture (void)
	{
		glu::TransferFormat		transferFmt		= glu::getTransferFormat(m_texFormat);
		int						pixelSize		= m_texFormat.getPixelSize();
		deUint32				tex				= 0;
		deUint32				buf				= 0;
		vector<deUint8>			data;

		DE_ASSERT(m_numLevels == 1);

		glGenTextures(1, &tex);
		glBindTexture(GL_TEXTURE_2D, tex);

		// First fill texture with gradient.
		data.resize(deAlign32(m_width*pixelSize, 4)*m_height);
		tcu::fillWithComponentGradients(tcu::PixelBufferAccess(m_texFormat, m_width, m_height, 1, deAlign32(m_width*pixelSize, 4), 0, &data[0]), m_texFormatInfo.valueMin, m_texFormatInfo.valueMax);
		glTexImage2D(GL_TEXTURE_2D, 0, m_internalFormat, m_width, m_height, 0, transferFmt.format, transferFmt.dataType, &data[0]);

		// Fill data with grid.
		{
			int		rowLength	= m_rowLength > 0 ? m_rowLength : m_subW;
			int		rowPitch	= deAlign32(rowLength*pixelSize, m_alignment);
			int		height		= m_subH + m_skipRows;
			Vec4	cScale		= m_texFormatInfo.valueMax-m_texFormatInfo.valueMin;
			Vec4	cBias		= m_texFormatInfo.valueMin;
			Vec4	colorA		= Vec4(1.0f, 0.0f, 0.0f, 1.0f)*cScale + cBias;
			Vec4	colorB		= Vec4(0.0f, 1.0f, 0.0f, 1.0f)*cScale + cBias;

			data.resize(rowPitch*height + m_offset);
			tcu::fillWithGrid(tcu::PixelBufferAccess(m_texFormat, m_subW, m_subH, 1, rowPitch, 0, &data[0] + m_skipRows*rowPitch + m_skipPixels*pixelSize + m_offset), 4, colorA, colorB);
		}

		glGenBuffers(1, &buf);
		glBindBuffer(GL_PIXEL_UNPACK_BUFFER,	buf);
		glBufferData(GL_PIXEL_UNPACK_BUFFER,	(int)data.size(), &data[0], GL_STATIC_DRAW);

		glPixelStorei(GL_UNPACK_ROW_LENGTH,		m_rowLength);
		glPixelStorei(GL_UNPACK_SKIP_ROWS,		m_skipRows);
		glPixelStorei(GL_UNPACK_SKIP_PIXELS,	m_skipPixels);
		glPixelStorei(GL_UNPACK_ALIGNMENT,		m_alignment);
		glTexSubImage2D(GL_TEXTURE_2D, 0, m_subX, m_subY, m_subW, m_subH, transferFmt.format, transferFmt.dataType, (const void*)(deUintptr)m_offset);
	}